

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest10::NegativeTest10(NegativeTest10 *this,Context *context)

{
  Context *context_local;
  NegativeTest10 *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"function_overloading_forbidden_for_subroutines",
             "Check that an overloaded function cannot be declared with subroutine and a program will fail to compile or link if any shader or stage contains two or more  functions with the same name if the name is associated with a subroutine type."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativeTest10_03233ea0;
  this->m_has_test_passed = true;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  std::
  vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
  ::vector(&this->m_test_cases);
  this->m_vs_id = 0;
  return;
}

Assistant:

NegativeTest10::NegativeTest10(deqp::Context& context)
	: TestCase(context, "function_overloading_forbidden_for_subroutines",
			   "Check that an overloaded function cannot be declared with subroutine and "
			   "a program will fail to compile or link if any shader or stage contains"
			   " two or more  functions with the same name if the name is associated with"
			   " a subroutine type.")
	, m_has_test_passed(true)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}